

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createVariable
          (Builder *this,Decoration precision,StorageClass storageClass,Id type,char *name,
          Id initializer,bool compilerGenerated)

{
  char *name_00;
  Id IVar1;
  Id IVar2;
  Instruction *this_00;
  Function *this_01;
  mapped_type_conflict *pmVar3;
  Id local_60;
  Id local_5c;
  Id debugResultId;
  Id local_50;
  Id local_4c;
  Id debugLocalVariableId;
  Instruction *local_40;
  Instruction *inst;
  byte local_2d;
  Id pointerType;
  bool compilerGenerated_local;
  char *pcStack_28;
  Id initializer_local;
  char *name_local;
  StorageClass local_18;
  Id type_local;
  StorageClass storageClass_local;
  Decoration precision_local;
  Builder *this_local;
  
  local_2d = compilerGenerated;
  pointerType = initializer;
  pcStack_28 = name;
  name_local._4_4_ = type;
  local_18 = storageClass;
  type_local = precision;
  _storageClass_local = this;
  inst._4_4_ = makePointer(this,storageClass,type);
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,inst._4_4_,OpVariable);
  local_40 = this_00;
  spv::Instruction::addImmediateOperand(this_00,local_18);
  if (pointerType != 0) {
    spv::Instruction::addIdOperand(local_40,pointerType);
  }
  if (local_18 == Function) {
    this_01 = Block::getParent(this->buildPoint);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
               &stack0xffffffffffffffb8,local_40);
    spv::Function::addLocalVariable
              (this_01,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                       &stack0xffffffffffffffb8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &stack0xffffffffffffffb8);
    if (((this->emitNonSemanticShaderDebugInfo & 1U) != 0) && ((local_2d & 1) == 0)) {
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,(key_type_conflict *)((long)&name_local + 4));
      IVar2 = createDebugLocalVariable(this,*pmVar3,pcStack_28,0);
      local_4c = IVar2;
      local_50 = spv::Instruction::getResultId(local_40);
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_50);
      IVar1 = local_4c;
      *pmVar3 = IVar2;
      IVar2 = spv::Instruction::getResultId(local_40);
      makeDebugDeclare(this,IVar1,IVar2);
    }
  }
  else {
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
               &stack0xffffffffffffffa8,local_40);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffa8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &stack0xffffffffffffffa8);
    Module::mapInstruction(&this->module,local_40);
    if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,(key_type_conflict *)((long)&name_local + 4));
      name_00 = pcStack_28;
      IVar1 = *pmVar3;
      IVar2 = spv::Instruction::getResultId(local_40);
      IVar1 = createDebugGlobalVariable(this,IVar1,name_00,IVar2);
      local_5c = IVar1;
      local_60 = spv::Instruction::getResultId(local_40);
      pmVar3 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_60);
      *pmVar3 = IVar1;
    }
  }
  if (pcStack_28 != (char *)0x0) {
    IVar1 = spv::Instruction::getResultId(local_40);
    addName(this,IVar1,pcStack_28);
  }
  IVar1 = spv::Instruction::getResultId(local_40);
  setPrecision(this,IVar1,type_local);
  IVar1 = spv::Instruction::getResultId(local_40);
  return IVar1;
}

Assistant:

Id Builder::createVariable(Decoration precision, StorageClass storageClass, Id type, const char* name, Id initializer,
    bool const compilerGenerated)
{
    Id pointerType = makePointer(storageClass, type);
    Instruction* inst = new Instruction(getUniqueId(), pointerType, OpVariable);
    inst->addImmediateOperand(storageClass);
    if (initializer != NoResult)
        inst->addIdOperand(initializer);

    switch (storageClass) {
    case StorageClassFunction:
        // Validation rules require the declaration in the entry block
        buildPoint->getParent().addLocalVariable(std::unique_ptr<Instruction>(inst));

        if (emitNonSemanticShaderDebugInfo && !compilerGenerated)
        {
            auto const debugLocalVariableId = createDebugLocalVariable(debugId[type], name);
            debugId[inst->getResultId()] = debugLocalVariableId;

            makeDebugDeclare(debugLocalVariableId, inst->getResultId());
        }

        break;

    default:
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
        module.mapInstruction(inst);

        if (emitNonSemanticShaderDebugInfo)
        {
            auto const debugResultId = createDebugGlobalVariable(debugId[type], name, inst->getResultId());
            debugId[inst->getResultId()] = debugResultId;
        }
        break;
    }

    if (name)
        addName(inst->getResultId(), name);
    setPrecision(inst->getResultId(), precision);

    return inst->getResultId();
}